

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int __fd;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  size_t sVar4;
  int *piVar5;
  size_t __nbytes;
  
  pvVar1 = a->format->data;
  __fd = *(int *)((long)pvVar1 + 0x30);
  if (__fd < 0) {
    *buff = (void *)0x0;
    *offset = 0;
    *size = 0;
  }
  else {
    pvVar3 = *(void **)((long)pvVar1 + 0x20);
    if (pvVar3 == (void *)0x0) {
      *(undefined8 *)((long)pvVar1 + 0x18) = 0x10000;
      pvVar3 = malloc(0x10000);
      *(void **)((long)pvVar1 + 0x20) = pvVar3;
      if (pvVar3 == (void *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
        return -0x1e;
      }
    }
    *buff = pvVar3;
    lVar2 = *(long *)((long)pvVar1 + 0x28);
    *offset = lVar2;
    __nbytes = *(long *)((long)pvVar1 + 0xa8) - lVar2;
    if ((long)*(size_t *)((long)pvVar1 + 0x18) < (long)__nbytes) {
      __nbytes = *(size_t *)((long)pvVar1 + 0x18);
    }
    sVar4 = read(__fd,*(void **)((long)pvVar1 + 0x20),__nbytes);
    if ((long)sVar4 < 0) {
      piVar5 = __errno_location();
      archive_set_error(&a->archive,*piVar5,"Can\'t read");
      return -0x14;
    }
    if (sVar4 != 0) {
      *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) + sVar4;
      *size = sVar4;
      return 0;
    }
    *size = 0;
  }
  return 1;
}

Assistant:

static int
read_data(struct archive_read *a, const void **buff, size_t *size,
    int64_t *offset)
{
	size_t bytes_to_read;
	ssize_t bytes_read;
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd < 0) {
		*buff = NULL;
		*offset = 0;
		*size = 0;
		return (ARCHIVE_EOF);
	}
	if (mtree->buff == NULL) {
		mtree->buffsize = 64 * 1024;
		mtree->buff = malloc(mtree->buffsize);
		if (mtree->buff == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
	}

	*buff = mtree->buff;
	*offset = mtree->offset;
	if ((int64_t)mtree->buffsize > mtree->cur_size - mtree->offset)
		bytes_to_read = (size_t)(mtree->cur_size - mtree->offset);
	else
		bytes_to_read = mtree->buffsize;
	bytes_read = read(mtree->fd, mtree->buff, bytes_to_read);
	if (bytes_read < 0) {
		archive_set_error(&a->archive, errno, "Can't read");
		return (ARCHIVE_WARN);
	}
	if (bytes_read == 0) {
		*size = 0;
		return (ARCHIVE_EOF);
	}
	mtree->offset += bytes_read;
	*size = bytes_read;
	return (ARCHIVE_OK);
}